

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadAnimationClipLibrary(ColladaParser *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  allocator local_d1;
  string animName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  clip;
  string local_50;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar2 == '\0') {
    do {
      while( true ) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((char)iVar2 == '\0') {
          return;
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar2 != 1) break;
        bVar1 = IsElement(this,"animation_clip");
        if (bVar1) {
          animName._M_dataplus._M_p = (pointer)&animName.field_2;
          animName._M_string_length = 0;
          animName.field_2._M_local_buf[0] = '\0';
          uVar3 = TestAttribute(this,"name");
          uVar4 = TestAttribute(this,"id");
          if (((int)uVar3 < 0) && (uVar3 = uVar4, (int)uVar4 < 0)) {
            std::__cxx11::string::string((string *)&local_b0,"animation_",&local_d1);
            to_string<unsigned_long>
                      (&local_50,
                       ((long)(this->mAnimationClipLibrary).
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->mAnimationClipLibrary).
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x38);
            std::operator+(&clip.first,&local_b0,&local_50);
            std::__cxx11::string::operator=((string *)&animName,(string *)&clip);
            std::__cxx11::string::~string((string *)&clip);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_b0);
          }
          else {
            (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
            std::__cxx11::string::assign((char *)&animName);
          }
          clip.first._M_dataplus._M_p = (pointer)&clip.first.field_2;
          clip.first._M_string_length = 0;
          clip.first.field_2._M_local_buf[0] = '\0';
          clip.second.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          clip.second.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          clip.second.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::_M_assign((string *)&clip);
          do {
            while( true ) {
              iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
              if ((char)iVar2 == '\0') goto LAB_003e9468;
              iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
              if (iVar2 != 1) break;
              bVar1 = IsElement(this,"instance_animation");
              if (bVar1) {
                uVar3 = TestAttribute(this,"url");
                if (-1 < (int)uVar3) {
                  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
                  if (*(char *)CONCAT44(extraout_var,iVar2) != '#') {
                    std::__cxx11::string::string
                              ((string *)&local_b0,"Unknown reference format",(allocator *)&local_50
                              );
                    ThrowException(this,&local_b0);
                  }
                  std::__cxx11::string::string
                            ((string *)&local_b0,(char *)CONCAT44(extraout_var,iVar2) + 1,
                             (allocator *)&local_50);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &clip.second,&local_b0);
                  std::__cxx11::string::~string((string *)&local_b0);
                }
              }
              else {
                SkipElement(this);
              }
            }
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          } while (iVar2 != 2);
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"animation_clip");
          if (iVar2 != 0) {
            std::__cxx11::string::string
                      ((string *)&local_b0,"Expected end of <animation_clip> element.",
                       (allocator *)&local_50);
            ThrowException(this,&local_b0);
          }
LAB_003e9468:
          if (clip.second.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              clip.second.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::push_back(&this->mAnimationClipLibrary,&clip);
          }
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~pair(&clip);
          std::__cxx11::string::~string((string *)&animName);
        }
        else {
          SkipElement(this);
        }
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar2 != 2);
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar2 = strcmp((char *)CONCAT44(extraout_var_01,iVar2),"library_animation_clips");
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)&clip,"Expected end of <library_animation_clips> element.",
                 (allocator *)&animName);
      ThrowException(this,&clip.first);
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadAnimationClipLibrary()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("animation_clip"))
            {
                // optional name given as an attribute
                std::string animName;
                int indexName = TestAttribute("name");
                int indexID = TestAttribute("id");
                if (indexName >= 0)
                    animName = mReader->getAttributeValue(indexName);
                else if (indexID >= 0)
                    animName = mReader->getAttributeValue(indexID);
                else
                    animName = std::string("animation_") + to_string(mAnimationClipLibrary.size());

                std::pair<std::string, std::vector<std::string> > clip;

                clip.first = animName;

                while (mReader->read())
                {
                    if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
                    {
                        if (IsElement("instance_animation"))
                        {
                            int indexUrl = TestAttribute("url");
                            if (indexUrl >= 0)
                            {
                                const char* url = mReader->getAttributeValue(indexUrl);
                                if (url[0] != '#')
                                    ThrowException("Unknown reference format");

                                url++;

                                clip.second.push_back(url);
                            }
                        }
                        else
                        {
                            // ignore the rest
                            SkipElement();
                        }
                    }
                    else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
                    {
                        if (strcmp(mReader->getNodeName(), "animation_clip") != 0)
                            ThrowException("Expected end of <animation_clip> element.");

                        break;
                    }
                }

                if (clip.second.size() > 0)
                {
                    mAnimationClipLibrary.push_back(clip);
                }
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "library_animation_clips") != 0)
                ThrowException("Expected end of <library_animation_clips> element.");

            break;
        }
    }
}